

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O1

void __thiscall bgui::BaseWindow::~BaseWindow(BaseWindow *this)

{
  int __fd;
  _XImage *p_Var1;
  BaseWindowData *pBVar2;
  pointer pcVar3;
  
  this->_vptr_BaseWindow = (_func_int **)&PTR__BaseWindow_00121bc8;
  sendClose(this);
  if (this->p->running == true) {
    pthread_join(this->p->thread,(void **)0x0);
    this->p->running = false;
  }
  pthread_mutex_destroy((pthread_mutex_t *)&this->p->mutex);
  __fd = this->p->inotify_fd;
  if (__fd != 0) {
    close(__fd);
  }
  p_Var1 = this->p->image;
  (*(p_Var1->f).destroy_image)(p_Var1);
  XFreeFontInfo(0,this->p->font,1);
  XFreeGC(this->p->display,this->p->gc);
  XDestroyWindow(this->p->display,this->p->window);
  XCloseDisplay(this->p->display);
  pBVar2 = this->p;
  if (pBVar2 != (BaseWindowData *)0x0) {
    pcVar3 = (pBVar2->text)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(pBVar2->text).field_2) {
      operator_delete(pcVar3);
    }
    pcVar3 = (pBVar2->info)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(pBVar2->info).field_2) {
      operator_delete(pcVar3);
    }
    operator_delete(pBVar2);
    return;
  }
  return;
}

Assistant:

BaseWindow::~BaseWindow()
{
  sendClose();
  waitForClose();

  pthread_mutex_destroy(&(p->mutex));

#ifdef INCLUDE_INOTIFY

  if (p->inotify_fd != 0)
  {
    close(p->inotify_fd);
  }

#endif

  XDestroyImage(p->image);
  XFreeFontInfo(0, p->font, 1);
  XFreeGC(p->display, p->gc);
  XDestroyWindow(p->display, p->window);
  XCloseDisplay(p->display);

  delete p;
}